

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorBuilder::IsInPackage
          (DescriptorBuilder *this,FileDescriptor *file,string_view package_name)

{
  pointer __s1;
  ulong uVar1;
  int iVar2;
  ulong __n;
  size_type __rlen;
  bool bVar3;
  
  __n = package_name._M_len;
  __s1 = (file->package_->_M_dataplus)._M_p;
  uVar1 = file->package_->_M_string_length;
  if (__n == 0) {
LAB_0039c053:
    bVar3 = true;
    if (uVar1 != __n) {
      bVar3 = __s1[__n] == '.';
    }
  }
  else {
    if (__n <= uVar1) {
      iVar2 = bcmp(__s1,package_name._M_str,__n);
      if (iVar2 == 0) goto LAB_0039c053;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool DescriptorBuilder::IsInPackage(const FileDescriptor* file,
                                    absl::string_view package_name) {
  return absl::StartsWith(file->package(), package_name) &&
         (file->package().size() == package_name.size() ||
          file->package()[package_name.size()] == '.');
}